

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles2::Functional::eval_faceForward_vec2(ShaderEvalContext *c)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  float fVar4;
  float res;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar4 = c->in[0].m_data[1];
  fVar1 = c->in[0].m_data[3];
  fVar5 = 0.0;
  fVar6 = c->in[2].m_data[2];
  fVar7 = c->in[1].m_data[1];
  bVar2 = true;
  do {
    bVar3 = bVar2;
    fVar5 = fVar5 + fVar6 * fVar7;
    fVar6 = c->in[2].m_data[1];
    fVar7 = c->in[1].m_data[0];
    bVar2 = false;
  } while (bVar3);
  if (0.0 <= fVar5) {
    fVar4 = -fVar4;
  }
  (c->color).m_data[1] =
       (float)(-(uint)(fVar5 < 0.0) & (uint)fVar1 | ~-(uint)(fVar5 < 0.0) & (uint)-fVar1);
  (c->color).m_data[2] = fVar4;
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }